

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_38e3a9::PostfixQualifiedType::printLeft
          (PostfixQualifiedType *this,OutputStream *s)

{
  (*this->Ty->_vptr_Node[4])();
  OutputStream::operator+=(s,this->Postfix);
  return;
}

Assistant:

void printLeft(OutputStream &s) const override {
    Ty->printLeft(s);
    s += Postfix;
  }